

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleIndexVertexMaterialArray.cpp
# Opt level: O0

void __thiscall
btTriangleIndexVertexMaterialArray::getLockedReadOnlyMaterialBase
          (btTriangleIndexVertexMaterialArray *this,uchar **materialBase,int *numMaterials,
          PHY_ScalarType *materialType,int *materialStride,uchar **triangleMaterialBase,
          int *numTriangles,int *triangleMaterialStride,PHY_ScalarType *triangleType,int subpart)

{
  btMaterialProperties *pbVar1;
  undefined4 *in_RCX;
  int *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  btMaterialProperties *mats;
  
  pbVar1 = btAlignedObjectArray<btMaterialProperties>::operator[]
                     ((btAlignedObjectArray<btMaterialProperties> *)(in_RDI + 0x68),
                      (int)numMaterials);
  *in_RDX = pbVar1->m_numMaterials;
  *in_RSI = pbVar1->m_materialBase;
  *in_RCX = 0;
  *in_R8 = pbVar1->m_materialStride;
  *(int *)triangleMaterialBase = pbVar1->m_numTriangles;
  *in_R9 = pbVar1->m_triangleMaterialsBase;
  *materialStride = pbVar1->m_triangleMaterialStride;
  *materialType = pbVar1->m_triangleType;
  return;
}

Assistant:

void btTriangleIndexVertexMaterialArray::getLockedReadOnlyMaterialBase(const unsigned char **materialBase, int& numMaterials, PHY_ScalarType& materialType, int& materialStride,
                                           const unsigned char ** triangleMaterialBase, int& numTriangles, int& triangleMaterialStride, PHY_ScalarType& triangleType, int subpart)
{
    btMaterialProperties& mats = m_materials[subpart];

    numMaterials = mats.m_numMaterials;
    (*materialBase) = (const unsigned char *) mats.m_materialBase;
#ifdef BT_USE_DOUBLE_PRECISION
    materialType = PHY_DOUBLE;
#else
    materialType = PHY_FLOAT;
#endif
    materialStride = mats.m_materialStride;

    numTriangles = mats.m_numTriangles;
    (*triangleMaterialBase) = (const unsigned char *)mats.m_triangleMaterialsBase;
    triangleMaterialStride = mats.m_triangleMaterialStride;
    triangleType = mats.m_triangleType;
}